

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

int32 compare(heapelement_t *l1,heapelement_t *l2)

{
  int local_1c;
  int32 diff;
  heapelement_t *l2_local;
  heapelement_t *l1_local;
  
  local_1c = strcmp(l2->basephone,l1->basephone);
  if ((((local_1c == 0) && (l2->leftcontext != (char *)0x0)) && (l1->leftcontext != (char *)0x0)) &&
     ((local_1c = strcmp(l2->leftcontext,l1->leftcontext), local_1c == 0 &&
      (local_1c = strcmp(l2->rightcontext,l1->rightcontext), local_1c == 0)))) {
    local_1c = strcmp(l2->wordposition,l1->wordposition);
  }
  return local_1c;
}

Assistant:

int32 compare(heapelement_t *l1, heapelement_t *l2)
{
    int32 diff;

    /* For increasing alphabetical order */
    if ((diff = strcmp(l2->basephone,l1->basephone)) == 0){
	if (l2->leftcontext != NULL && l1->leftcontext != NULL){

	    /* These are triphones */
            if ((diff = strcmp(l2->leftcontext,l1->leftcontext)) == 0){
                if ((diff = strcmp(l2->rightcontext,l1->rightcontext)) == 0){
                    diff = strcmp(l2->wordposition,l1->wordposition);
                }
            }
        }
    }
    return diff;
}